

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderSupplementalData.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::Mode5TransponderSupplementalData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Mode5TransponderSupplementalData *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Mode5TransponderSupplementalData *local_18;
  Mode5TransponderSupplementalData *this_local;
  
  local_18 = this;
  this_local = (Mode5TransponderSupplementalData *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Mode 5 Transponder Supplemental Data:");
  poVar1 = std::operator<<(poVar1,"\n\tSquitter: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((this->m_SupplementalDataUnion).m_ui8SupplementalData & 1));
  poVar1 = std::operator<<(poVar1,"\n\tLevel 2 Squiter: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((this->m_SupplementalDataUnion).m_ui8SupplementalData >> 1 & 1))
  ;
  poVar1 = std::operator<<(poVar1,"\n\tIFF Mission: ");
  poVar1 = std::operator<<(poVar1,(this->m_SupplementalDataUnion).m_ui8SupplementalData >> 2 & 7);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Mode5TransponderSupplementalData::GetAsString() const
{
    KStringStream ss;	
	ss << "Mode 5 Transponder Supplemental Data:"
	   << "\n\tSquitter: "        << ( KBOOL )m_SupplementalDataUnion.m_ui8SquitterStatus 
	   << "\n\tLevel 2 Squiter: " << ( KBOOL )m_SupplementalDataUnion.m_ui8Lvl2SquitterStatus
	   << "\n\tIFF Mission: "     << m_SupplementalDataUnion.m_ui8IFFMission
	   << "\n";
    return ss.str();
}